

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O1

void __thiscall QWidgetTextControl::insertFromMimeData(QWidgetTextControl *this,QMimeData *source)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  QArrayData *pQVar4;
  qsizetype qVar5;
  char cVar6;
  long in_FS_OFFSET;
  QStringView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QLatin1String QVar13;
  QTextDocumentFragment fragment;
  QArrayData *local_e0 [2];
  storage_type *local_d0;
  QStringBuilder<QLatin1String,_QString> local_c8;
  QArrayData *local_98;
  char16_t *pcStack_90;
  QArrayData *local_88;
  QString local_78;
  QArrayDataPointer<QString> local_58;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((source == (QMimeData *)0x0) ||
     (lVar2 = *(long *)(this + 8), (*(uint *)(lVar2 + 0xb0) & 0x10) == 0)) goto LAB_004d00cf;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QTextDocumentFragment::QTextDocumentFragment((QTextDocumentFragment *)&local_40);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d._0_4_ = 0xaaaaaaaa;
  local_58.d._4_4_ = 0xaaaaaaaa;
  local_58.ptr._0_4_ = 0xaaaaaaaa;
  local_58.ptr._4_4_ = 0xaaaaaaaa;
  (**(code **)(*(long *)source + 0x68))(&local_58,source);
  if (((undefined1 *)local_58.size == (undefined1 *)0x0) ||
     ((*(long *)(CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_) + 0x10) != 0xd ||
      (QVar7.m_data = *(storage_type_conflict **)
                       (CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_) + 8), QVar7.m_size = 0xd,
      QVar13.m_data = "text/markdown", QVar13.m_size = 0xd,
      cVar6 = QtPrivate::equalStrings(QVar7,QVar13), cVar6 == '\0')))) {
    QVar10.m_data = (storage_type *)0x17;
    QVar10.m_size = (qsizetype)&local_c8;
    QString::fromLatin1(QVar10);
    local_78.d.d = (Data *)local_c8.a.m_size;
    local_78.d.ptr = (char16_t *)local_c8.a.m_data;
    local_78.d.size = (qsizetype)local_c8.b.d.d;
    cVar6 = (**(code **)(*(long *)source + 0x60))(source);
    if (cVar6 == '\0') {
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    else {
      cVar6 = *(char *)(lVar2 + 0x111);
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (cVar6 != '\0') {
        local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QVar11.m_data = (storage_type *)0x17;
        QVar11.m_size = (qsizetype)&local_c8;
        QString::fromLatin1(QVar11);
        qVar5 = local_c8.a.m_size;
        QMimeData::data((QString *)local_e0);
        QVar12.m_data = local_d0;
        QVar12.m_size = (qsizetype)&local_98;
        QString::fromUtf8(QVar12);
        local_c8.b.d.size = (qsizetype)local_88;
        local_c8.b.d.ptr = pcStack_90;
        local_c8.b.d.d = (Data *)local_98;
        local_c8.a.m_size = 0x25;
        local_c8.a.m_data = "<meta name=\"qrichtext\" content=\"1\" />";
        local_98 = (QArrayData *)0x0;
        pcStack_90 = (char16_t *)0x0;
        local_88 = (QArrayData *)0x0;
        QStringBuilder<QLatin1String,_QString>::convertTo<QString>(&local_78,&local_c8);
        if (&(local_c8.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_c8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_c8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
          ;
          UNLOCK();
          if (((local_c8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_c8.b.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (local_98 != (QArrayData *)0x0) {
          LOCK();
          (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_98,2,0x10);
          }
        }
        if (local_e0[0] != (QArrayData *)0x0) {
          LOCK();
          (local_e0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_e0[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_e0[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_e0[0],1,0x10);
          }
        }
        if ((QArrayData *)qVar5 != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)qVar5)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)qVar5)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)qVar5)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)qVar5,2,0x10);
          }
        }
        QTextDocumentFragment::fromHtml((QString *)&local_c8,(QTextDocument *)&local_78);
        goto LAB_004cff23;
      }
    }
    cVar6 = QMimeData::hasHtml();
    if ((cVar6 != '\0') && (*(char *)(lVar2 + 0x111) == '\x01')) {
      QMimeData::html();
      QTextDocumentFragment::fromHtml((QString *)&local_78,(QTextDocument *)&local_c8);
      QTextDocumentFragment::operator=
                ((QTextDocumentFragment *)&local_40,(QTextDocumentFragment *)&local_78);
      QTextDocumentFragment::~QTextDocumentFragment((QTextDocumentFragment *)&local_78);
      if ((QArrayData *)local_c8.a.m_size != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_c8.a.m_size)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_c8.a.m_size)->_q_value).super___atomic_base<int>._M_i + -1;
        iVar1 = (((QBasicAtomicInt *)local_c8.a.m_size)->_q_value).super___atomic_base<int>._M_i;
        UNLOCK();
        pQVar4 = (QArrayData *)local_c8.a.m_size;
        goto joined_r0x004cffe8;
      }
      goto LAB_004cfffe;
    }
    bVar3 = false;
  }
  else {
    local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QVar8.m_data = (storage_type *)0xd;
    QVar8.m_size = (qsizetype)&local_c8;
    QString::fromLatin1(QVar8);
    local_98 = (QArrayData *)local_c8.a.m_size;
    pcStack_90 = (char16_t *)local_c8.a.m_data;
    local_88 = &(local_c8.b.d.d)->super_QArrayData;
    QMimeData::data((QString *)&local_c8);
    QVar9.m_data = (storage_type *)local_c8.b.d.d;
    QVar9.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar9);
    if ((QArrayData *)local_c8.a.m_size != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_c8.a.m_size)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_c8.a.m_size)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_c8.a.m_size)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_c8.a.m_size,1,0x10);
      }
    }
    if (local_98 != (QArrayData *)0x0) {
      LOCK();
      (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_98,2,0x10);
      }
    }
    QTextDocumentFragment::fromMarkdown(&local_c8,&local_78,0x104f0c);
LAB_004cff23:
    QTextDocumentFragment::operator=
              ((QTextDocumentFragment *)&local_40,(QTextDocumentFragment *)&local_c8);
    QTextDocumentFragment::~QTextDocumentFragment((QTextDocumentFragment *)&local_c8);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      iVar1 = ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
      pQVar4 = &(local_78.d.d)->super_QArrayData;
joined_r0x004cffe8:
      if (iVar1 == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
LAB_004cfffe:
    bVar3 = true;
  }
  if (!bVar3) {
    local_c8.b.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.a.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.a.m_data = &DAT_aaaaaaaaaaaaaaaa;
    QMimeData::text();
    if ((char16_t *)local_c8.a.m_data != (char16_t *)0x0) {
      QTextDocumentFragment::fromPlainText((QString *)&local_78);
      QTextDocumentFragment::operator=
                ((QTextDocumentFragment *)&local_40,(QTextDocumentFragment *)&local_78);
      QTextDocumentFragment::~QTextDocumentFragment((QTextDocumentFragment *)&local_78);
      bVar3 = true;
    }
    if ((QArrayData *)local_c8.a.m_size != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_c8.a.m_size)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_c8.a.m_size)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_c8.a.m_size)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_c8.a.m_size,2,0x10);
      }
    }
  }
  if (bVar3) {
    QTextCursor::insertFragment((QTextDocumentFragment *)(lVar2 + 0x88));
  }
  (**(code **)(*(long *)this + 0x60))(this);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  QTextDocumentFragment::~QTextDocumentFragment((QTextDocumentFragment *)&local_40);
LAB_004d00cf:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControl::insertFromMimeData(const QMimeData *source)
{
    Q_D(QWidgetTextControl);
    if (!(d->interactionFlags & Qt::TextEditable) || !source)
        return;

    bool hasData = false;
    QTextDocumentFragment fragment;
#if QT_CONFIG(textmarkdownreader)
    const auto formats = source->formats();
    if (formats.size() && formats.first() == "text/markdown"_L1) {
        auto s = QString::fromUtf8(source->data("text/markdown"_L1));
        fragment = QTextDocumentFragment::fromMarkdown(s);
        hasData = true;
    } else
#endif
#ifndef QT_NO_TEXTHTMLPARSER
    if (source->hasFormat("application/x-qrichtext"_L1) && d->acceptRichText) {
        // x-qrichtext is always UTF-8 (taken from Qt3 since we don't use it anymore).
        const QString richtext = "<meta name=\"qrichtext\" content=\"1\" />"_L1
                + QString::fromUtf8(source->data("application/x-qrichtext"_L1));
        fragment = QTextDocumentFragment::fromHtml(richtext, d->doc);
        hasData = true;
    } else if (source->hasHtml() && d->acceptRichText) {
        fragment = QTextDocumentFragment::fromHtml(source->html(), d->doc);
        hasData = true;
    }
#endif // QT_NO_TEXTHTMLPARSER
    if (!hasData) {
        const QString text = source->text();
        if (!text.isNull()) {
            fragment = QTextDocumentFragment::fromPlainText(text);
            hasData = true;
        }
    }

    if (hasData)
        d->cursor.insertFragment(fragment);
    ensureCursorVisible();
}